

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

void nullcRemoveModule(char *module)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  TraceScope traceScope;
  TraceScope local_30;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    if (nullcRemoveModule::token == '\0') {
      iVar4 = __cxa_guard_acquire(&nullcRemoveModule::token);
      if (iVar4 != 0) {
        nullcRemoveModule::token = NULLC::TraceGetToken("nullc","nullcRemoveModule");
        __cxa_guard_release(&nullcRemoveModule::token);
      }
    }
    NULLC::TraceScope::TraceScope(&local_30,nullcRemoveModule::token);
    lVar3 = NULLC::traceContext;
    sVar5 = strlen(module);
    uVar6 = (int)sVar5 + 1;
    if ((*(uint *)(lVar3 + 0x264) <= *(int *)(lVar3 + 0x260) + uVar6) ||
       (*(int *)(lVar3 + 0x270) == *(int *)(lVar3 + 0x274))) {
      NULLC::TraceDump();
    }
    if (*(uint *)(lVar3 + 0x264) <= uVar6) {
      __assert_fail("count < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x127,"void NULLC::TraceLabel(const char *)");
    }
    uVar1 = *(uint *)(lVar3 + 0x260);
    memcpy((void *)((ulong)uVar1 + *(long *)(lVar3 + 0x268)),module,(ulong)uVar6);
    *(int *)(lVar3 + 0x260) = *(int *)(lVar3 + 0x260) + uVar6;
    lVar2 = *(long *)(lVar3 + 0x278);
    uVar6 = *(uint *)(lVar3 + 0x270);
    *(uint *)(lVar3 + 0x270) = uVar6 + 1;
    *(uint *)(lVar2 + (ulong)uVar6 * 8) = uVar1 * 4 + 2;
    *(undefined4 *)(lVar2 + 4 + (ulong)uVar6 * 8) = 0;
    BinaryCache::RemoveBytecode(module);
    NULLC::TraceScope::~TraceScope(&local_30);
  }
  return;
}

Assistant:

void nullcRemoveModule(const char* module)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED((void)false);

	TRACE_SCOPE("nullc", "nullcRemoveModule");
	TRACE_LABEL(module);

	BinaryCache::RemoveBytecode(module);
}